

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

CURLcode Curl_altsvc_save(Curl_easy *data,altsvcinfo *altsvc,char *file)

{
  FILE *pFVar1;
  CURLcode CVar2;
  int iVar3;
  Curl_llist_node *pCVar4;
  undefined8 *puVar5;
  char *pcVar6;
  char *pcVar7;
  CURLcode CVar8;
  char *pcVar9;
  char *tempstore;
  FILE *out;
  char *local_d0;
  ulong local_c8;
  ulong local_c0;
  char *local_b8;
  ulong local_b0;
  ulong local_a8;
  FILE *local_a0;
  char *local_98;
  char *local_90;
  Curl_llist_node *local_88;
  tm stamp;
  char ipv6_unused [16];
  
  tempstore = (char *)0x0;
  CVar8 = CURLE_OK;
  CVar2 = CURLE_OK;
  if (altsvc != (altsvcinfo *)0x0) {
    if (file == (char *)0x0) {
      file = altsvc->filename;
    }
    CVar2 = CVar8;
    if (((file != (char *)0x0) && ((altsvc->flags & 4U) == 0)) && (*file != '\0')) {
      CVar2 = Curl_fopen(data,file,&out,&tempstore);
      if (CVar2 == CURLE_OK) {
        local_d0 = file;
        fputs("# Your alt-svc cache. https://curl.se/docs/alt-svc.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)out);
        pCVar4 = Curl_llist_head(&altsvc->list);
        if (pCVar4 == (Curl_llist_node *)0x0) {
          CVar2 = CURLE_OK;
        }
        else {
          do {
            puVar5 = (undefined8 *)Curl_node_elem(pCVar4);
            pCVar4 = Curl_node_next(pCVar4);
            pFVar1 = out;
            CVar2 = Curl_gmtime(puVar5[4],&stamp);
            if (CVar2 != CURLE_OK) break;
            local_a0 = pFVar1;
            iVar3 = inet_pton(10,(char *)puVar5[2],ipv6_unused);
            local_90 = "";
            if (iVar3 == 1) {
              local_90 = "[";
            }
            local_98 = "";
            if (iVar3 == 1) {
              local_98 = "]";
            }
            iVar3 = inet_pton(10,(char *)*puVar5,ipv6_unused);
            pcVar6 = "[";
            pcVar9 = "]";
            if (iVar3 != 1) {
              pcVar6 = "";
              pcVar9 = "";
            }
            iVar3 = *(int *)((long)puVar5 + 0xc);
            pcVar7 = "h1";
            if (iVar3 != 8) {
              if (iVar3 == 0x20) {
                pcVar7 = "h3";
              }
              else if (iVar3 == 0x10) {
                pcVar7 = "h2";
              }
              else {
                pcVar7 = "";
              }
            }
            local_a8 = (ulong)*(ushort *)(puVar5 + 1);
            iVar3 = *(int *)((long)puVar5 + 0x1c);
            local_b8 = "h1";
            if (iVar3 != 8) {
              if (iVar3 == 0x20) {
                local_b8 = "h3";
              }
              else if (iVar3 == 0x10) {
                local_b8 = "h2";
              }
              else {
                local_b8 = "";
              }
            }
            local_b0 = (ulong)*(ushort *)(puVar5 + 3);
            local_c0 = (ulong)(uint)stamp.tm_mday;
            local_c8 = (ulong)(uint)stamp.tm_hour;
            CVar2 = CURLE_OK;
            local_88 = pCVar4;
            curl_mfprintf(local_a0,"%s %s%s%s %u %s %s%s%s %u \"%d%02d%02d %02d:%02d:%02d\" %u %u\n"
                          ,pcVar7,pcVar6,*puVar5,pcVar9,local_a8,local_b8,local_90,puVar5[2],
                          local_98,local_b0,(ulong)(stamp.tm_year + 0x76c),(ulong)(stamp.tm_mon + 1)
                          ,local_c0,local_c8,(ulong)(uint)stamp.tm_min,(ulong)(uint)stamp.tm_sec,
                          (ulong)(*(byte *)((long)puVar5 + 0x4c) & 1),(ulong)*(uint *)(puVar5 + 9));
            pCVar4 = local_88;
          } while (local_88 != (Curl_llist_node *)0x0);
        }
        fclose((FILE *)out);
        if (tempstore != (char *)0x0 && CVar2 == CURLE_OK) {
          iVar3 = Curl_rename(tempstore,local_d0);
          CVar2 = CURLE_WRITE_ERROR;
          if (iVar3 == 0) {
            CVar2 = CURLE_OK;
          }
        }
        if (tempstore != (char *)0x0 && CVar2 != CURLE_OK) {
          unlink(tempstore);
        }
      }
      (*Curl_cfree)(tempstore);
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_altsvc_save(struct Curl_easy *data,
                          struct altsvcinfo *altsvc, const char *file)
{
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!altsvc)
    /* no cache activated */
    return CURLE_OK;

  /* if not new name is given, use the one we stored from the load */
  if(!file && altsvc->filename)
    file = altsvc->filename;

  if((altsvc->flags & CURLALTSVC_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length filename */
    return CURLE_OK;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    fputs("# Your alt-svc cache. https://curl.se/docs/alt-svc.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = Curl_llist_head(&altsvc->list); e; e = n) {
      struct altsvc *as = Curl_node_elem(e);
      n = Curl_node_next(e);
      result = altsvc_out(as, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
  return result;
}